

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O0

ON_RTree * __thiscall ON_SubDMeshImpl::FragmentTree(ON_SubDMeshImpl *this)

{
  uint uVar1;
  ON_RTree *this_00;
  ON_RTree *local_48;
  ON_SubDMeshFragment *local_30;
  ON_SubDMeshFragment *fragment;
  ON_RTree *fragment_tree;
  ON_SubDMeshImpl *this_local;
  
  if ((this->m_fragment_tree != (ON_RTree *)0x0) &&
     (this->m_first_fragment != (ON_SubDMeshFragment *)0x0)) {
    this_00 = (ON_RTree *)operator_new(0x48);
    ON_RTree::ON_RTree(this_00,0);
    for (local_30 = this->m_first_fragment; local_30 != (ON_SubDMeshFragment *)0x0;
        local_30 = local_30->m_next_fragment) {
      uVar1 = ON_SubDMeshFragment::PointCount(local_30);
      if (uVar1 != 0) {
        ON_RTree::Insert(this_00,(double *)&local_30->m_surface_bbox,
                         &(local_30->m_surface_bbox).m_max.x,local_30);
      }
    }
    this->m_fragment_tree = this_00;
  }
  if (this->m_fragment_tree == (ON_RTree *)0x0) {
    local_48 = &ON_RTree::Empty;
  }
  else {
    local_48 = this->m_fragment_tree;
  }
  return local_48;
}

Assistant:

const ON_RTree& ON_SubDMeshImpl::FragmentTree() const
{
  if (nullptr != m_fragment_tree && nullptr != m_first_fragment)
  {
    ON_RTree* fragment_tree = new ON_RTree();
    for (const ON_SubDMeshFragment* fragment = m_first_fragment; nullptr != fragment; fragment = fragment->m_next_fragment)
    {
      if (fragment->PointCount() > 0 )
        fragment_tree->Insert(&(fragment->m_surface_bbox.m_min.x), &(fragment->m_surface_bbox.m_max.x), (void*)fragment);
    }
    const_cast< ON_SubDMeshImpl* >(this)->m_fragment_tree = fragment_tree;
  }
  return (nullptr == m_fragment_tree ) ? ON_RTree::Empty : *m_fragment_tree;
}